

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::toString<char>(void)

{
  size_type sVar1;
  size_type sVar2;
  String *in_RDI;
  String ret;
  
  String::String(&ret,"String doctest::toString() [T = char]");
  sVar1 = String::find(&ret,'=',0);
  sVar2 = String::size(&ret);
  String::substr(in_RDI,&ret,sVar1 + 2,(sVar2 - sVar1) - 3);
  String::~String(&ret);
  return in_RDI;
}

Assistant:

String toString() {
#if DOCTEST_CLANG == 0 && DOCTEST_GCC == 0 && DOCTEST_ICC == 0
    String ret = __FUNCSIG__; // class doctest::String __cdecl doctest::toString<TYPE>(void)
    String::size_type beginPos = ret.find('<');
    return ret.substr(beginPos + 1, ret.size() - beginPos - static_cast<String::size_type>(sizeof(">(void)")));
#else
    String ret = __PRETTY_FUNCTION__; // doctest::String toString() [with T = TYPE]
    String::size_type begin = ret.find('=') + 2;
    return ret.substr(begin, ret.size() - begin - 1);
#endif
}